

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

void __thiscall
antlr::ASTFactory::ASTFactory(ASTFactory *this,char *factory_node_name,factory_type fact)

{
  size_type in_RDX;
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  *in_RSI;
  _func_ASTRefCount<antlr::AST> **in_RDI;
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> pVar1;
  value_type *__x;
  
  *in_RDI = (_func_ASTRefCount<antlr::AST> *)&PTR__ASTFactory_005065b0;
  __x = (value_type *)(in_RDI + 1);
  pVar1 = std::make_pair<char_const*&,antlr::ASTRefCount<antlr::AST>(*&)()>((char **)__x,in_RDI);
  *(pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)(in_RDI + 1) = pVar1;
  std::
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::vector((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            *)0x1bc638);
  std::
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::resize(in_RSI,in_RDX,__x);
  return;
}

Assistant:

ASTFactory::ASTFactory( const char* factory_node_name, factory_type fact )
: default_factory_descriptor(ANTLR_USE_NAMESPACE(std)make_pair(factory_node_name, fact))
{
	nodeFactories.resize( Token::MIN_USER_TYPE, &default_factory_descriptor );
}